

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O1

jieba_word_weight_t * jieba_extract_with_weight(jieba_t *handle,char *sentence,int top_k)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  jieba_word_weight_t *pjVar4;
  char *pcVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  words;
  allocator local_69;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_68;
  string local_50;
  
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_50,sentence,&local_69);
  cppjieba::KeywordExtractor::Extract
            ((KeywordExtractor *)(handle + 0x578),&local_50,&local_68,(long)top_k);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ppVar2 = local_68.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = local_68.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)local_68.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  pjVar4 = (jieba_word_weight_t *)malloc(lVar3 * -0x3333333333333330 + 0x10);
  if (ppVar2 != ppVar1) {
    lVar8 = lVar3 * -0x3333333333333333 + (ulong)(lVar3 * -0x3333333333333333 == 0);
    pdVar6 = &pjVar4->weight;
    pdVar7 = &ppVar1->second;
    do {
      pcVar5 = strdup((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)(pdVar7 + -4))->first)._M_dataplus._M_p);
      ((jieba_word_weight_t *)(pdVar6 + -1))->word = pcVar5;
      *pdVar6 = *pdVar7;
      pdVar6 = pdVar6 + 2;
      pdVar7 = pdVar7 + 5;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  pjVar4[lVar3 * -0x333333333333333].word = (char *)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~vector(&local_68);
  return pjVar4;
}

Assistant:

jieba_word_weight_t* jieba_extract_with_weight(jieba_t* handle, const char* sentence, int top_k) {
  std::vector<std::pair<std::string, double> > words;
  ((cppjieba::Jieba*)handle)->extractor.Extract(sentence, words, top_k);
  jieba_word_weight_t* res = convert_word_weights(words);
  return res;
}